

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu-hash64.c
# Opt level: O0

uint hpte_page_shift(PPCHash64SegmentPageSizes *sps,uint64_t pte0,uint64_t pte1)

{
  PPCHash64PageSize *pPVar1;
  uint64_t mask;
  PPCHash64PageSize *ps;
  int i;
  uint64_t pte1_local;
  uint64_t pte0_local;
  PPCHash64SegmentPageSizes *sps_local;
  
  if ((pte0 & 4) == 0) {
    if (sps->page_shift == 0xc) {
      sps_local._4_4_ = 0xc;
    }
    else {
      sps_local._4_4_ = 0;
    }
  }
  else {
    ps._4_4_ = 0;
    while ((ps._4_4_ < 8 && (pPVar1 = sps->enc + ps._4_4_, pPVar1->page_shift != 0))) {
      if ((pPVar1->page_shift != 0xc) &&
         ((pte1 & (1L << ((byte)pPVar1->page_shift & 0x3f)) - 1U & 0xffffffffffff000) ==
          (ulong)pPVar1->pte_enc << 0xc)) {
        return pPVar1->page_shift;
      }
      ps._4_4_ = ps._4_4_ + 1;
    }
    sps_local._4_4_ = 0;
  }
  return sps_local._4_4_;
}

Assistant:

static unsigned hpte_page_shift(const PPCHash64SegmentPageSizes *sps,
                                uint64_t pte0, uint64_t pte1)
{
    int i;

    if (!(pte0 & HPTE64_V_LARGE)) {
        if (sps->page_shift != 12) {
            /* 4kiB page in a non 4kiB segment */
            return 0;
        }
        /* Normal 4kiB page */
        return 12;
    }

    for (i = 0; i < PPC_PAGE_SIZES_MAX_SZ; i++) {
        const PPCHash64PageSize *ps = &sps->enc[i];
        uint64_t mask;

        if (!ps->page_shift) {
            break;
        }

        if (ps->page_shift == 12) {
            /* L bit is set so this can't be a 4kiB page */
            continue;
        }

        mask = ((1ULL << ps->page_shift) - 1) & HPTE64_R_RPN;

        if ((pte1 & mask) == ((uint64_t)ps->pte_enc << HPTE64_R_RPN_SHIFT)) {
            return ps->page_shift;
        }
    }

    return 0; /* Bad page size encoding */
}